

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq_complexity.c
# Opt level: O0

_Bool is_frame_aq_enabled(AV1_COMP *cpi)

{
  int iVar1;
  long in_RDI;
  RefreshFrameInfo *refresh_frame;
  AV1_COMMON *cm;
  undefined1 local_1a;
  undefined1 local_19;
  
  iVar1 = frame_is_intra_only((AV1_COMMON *)(in_RDI + 0x3bf80));
  local_19 = 1;
  if (((iVar1 == 0) && (local_19 = 1, (*(byte *)(in_RDI + 0x3c176) & 1) == 0)) &&
     (local_19 = 1, (*(byte *)(in_RDI + 0x42d7a) & 1) == 0)) {
    local_1a = 0;
    if ((*(byte *)(in_RDI + 0x42d78) & 1) != 0) {
      local_1a = *(int *)(in_RDI + 0x607a8) != 0 ^ 0xff;
    }
    local_19 = local_1a;
  }
  return (_Bool)(local_19 & 1);
}

Assistant:

static bool is_frame_aq_enabled(const AV1_COMP *const cpi) {
  const AV1_COMMON *const cm = &cpi->common;
  const RefreshFrameInfo *const refresh_frame = &cpi->refresh_frame;

  return frame_is_intra_only(cm) || cm->features.error_resilient_mode ||
         refresh_frame->alt_ref_frame ||
         (refresh_frame->golden_frame && !cpi->rc.is_src_frame_alt_ref);
}